

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O1

void __thiscall liblogger::LogUnixServer::~LogUnixServer(LogUnixServer *this)

{
  list<int,_std::allocator<int>_> *plVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  pointer pcVar4;
  _List_node_base *p_Var5;
  int iVar6;
  ssize_t sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char value;
  void *ret;
  undefined1 local_21;
  void *local_20;
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogUnixServer_001469e8;
  if (this->m_running == true) {
    local_21 = 0x51;
    sVar7 = write(this->m_ctlfd[1],&local_21,1);
    if (sVar7 != 1) goto LAB_00137980;
    local_20 = (void *)0x0;
    iVar6 = pthread_join(this->m_thread,&local_20);
    if (iVar6 != 0) goto LAB_00137980;
    this->m_running = false;
  }
  plVar1 = &this->m_list;
  while (p_Var3 = (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next, p_Var3 != (_List_node_base *)plVar1) {
    iVar6 = close(*(int *)&p_Var3[1]._M_next);
    if (iVar6 < 0) goto LAB_00137980;
    p_Var3 = (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    psVar2 = &(this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
  }
  if ((((this->m_acceptfd < 0) || (iVar6 = close(this->m_acceptfd), -1 < iVar6)) &&
      ((this->m_ctlfd[0] < 0 || (iVar6 = close(this->m_ctlfd[0]), -1 < iVar6)))) &&
     (((this->m_ctlfd[1] < 0 || (iVar6 = close(this->m_ctlfd[1]), -1 < iVar6)) &&
      (iVar6 = pthread_mutex_destroy((pthread_mutex_t *)&this->m_mutex), iVar6 == 0)))) {
    pcVar4 = (this->m_path)._M_dataplus._M_p;
    paVar8 = &(this->m_path).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar8) {
      operator_delete(pcVar4,paVar8->_M_allocated_capacity + 1);
    }
    p_Var3 = (plVar1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar1) {
      p_Var5 = p_Var3->_M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var5;
    }
    return;
  }
LAB_00137980:
  abort();
}

Assistant:

LogUnixServer::~LogUnixServer()
{
	if (m_running)
	{
		char value = 'Q';

		if (write(m_ctlfd[1], &value, sizeof(value)) != sizeof(value))
		{
			abort();
		}

		void *ret = NULL;
		if (pthread_join(m_thread, &ret) != 0)
		{
			abort();
		}
		m_running = false;
	}

	//No background thread. So no locking required from this point on

	while(!m_list.empty())
	{
		int fd = m_list.front();
		if (close(fd) < 0)
			abort();
		m_list.pop_front();
	}

	if (m_acceptfd >= 0)
	{
		if (close(m_acceptfd) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[0] >= 0)
	{
		if (close(m_ctlfd[0]) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[1] >= 0)
	{
		if (close(m_ctlfd[1]) < 0)
		{
			abort();
		}
	}

	if (pthread_mutex_destroy(&m_mutex) != 0)
		abort();

}